

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

iterator * __thiscall Catch::clara::TextFlow::Column::iterator::operator++(iterator *this)

{
  char cVar1;
  void *pvVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  Column *pCVar6;
  pointer pbVar7;
  iterator *this_00;
  
  uVar5 = this->m_pos + this->m_len;
  this->m_pos = uVar5;
  pCVar6 = this->m_column;
  uVar4 = this->m_stringIndex;
  pbVar7 = (pCVar6->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar5 < *(size_type *)((long)(pbVar7 + uVar4) + 8)) {
    this_00 = (iterator *)(pbVar7 + uVar4);
    if (((_Alloc_hider *)&this_00->m_column)->_M_p[uVar5] == '\n') {
      uVar5 = uVar5 + 1;
      this->m_pos = uVar5;
    }
    else {
      while( true ) {
        cVar1 = *(char *)((long)&(this_00->m_column->m_strings).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar5);
        if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
          operator++(this_00);
        }
        pvVar2 = isWhitespace(char)::chars_abi_cxx11_;
        if (DAT_00185d08 == 0) break;
        pvVar3 = memchr(isWhitespace(char)::chars_abi_cxx11_,(int)cVar1,DAT_00185d08);
        uVar5 = this->m_pos;
        if ((pvVar3 == (void *)0x0) || ((long)pvVar3 - (long)pvVar2 == -1)) goto LAB_0013ec80;
        uVar5 = uVar5 + 1;
        this->m_pos = uVar5;
        pbVar7 = (this->m_column->m_strings).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_00 = (iterator *)(pbVar7 + this->m_stringIndex);
        if (*(size_type *)((long)(pbVar7 + this->m_stringIndex) + 8) <= uVar5) goto LAB_0013ec80;
      }
      uVar5 = this->m_pos;
LAB_0013ec80:
      pCVar6 = this->m_column;
      uVar4 = this->m_stringIndex;
      pbVar7 = (pCVar6->m_strings).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  if (uVar5 == *(size_type *)((long)(pbVar7 + uVar4) + 8)) {
    this->m_pos = 0;
    uVar4 = uVar4 + 1;
    this->m_stringIndex = uVar4;
  }
  if (uVar4 < (ulong)((long)(pCVar6->m_strings).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5)) {
    calcLength(this);
  }
  return this;
}

Assistant:

auto operator ++() -> iterator& {
			m_pos += m_len;
			if (m_pos < line().size() && line()[m_pos] == '\n')
				m_pos += 1;
			else
				while (m_pos < line().size() && isWhitespace(line()[m_pos]))
					++m_pos;

			if (m_pos == line().size()) {
				m_pos = 0;
				++m_stringIndex;
			}
			if (m_stringIndex < m_column.m_strings.size())
				calcLength();
			return *this;
		}